

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigMan.c
# Opt level: O0

Fraig_Man_t * Fraig_ManCreate(Fraig_Params_t *pParams)

{
  Fraig_Man_t *p_00;
  Fraig_MemFixed_t *pFVar1;
  Fraig_NodeVec_t *pFVar2;
  Fraig_HashTable_t *pFVar3;
  Fraig_Node_t *pFVar4;
  Msat_IntVec_t *pMVar5;
  Fraig_Man_t *p;
  Fraig_Params_t Params;
  Fraig_Params_t *pParams_local;
  
  Params.nInspLimit = (ABC_INT64_T)pParams;
  Aig_ManRandom(1);
  if (Params.nInspLimit == 0) {
    Params.nInspLimit = (ABC_INT64_T)&p;
    Fraig_ParamsSetDefault((Fraig_Params_t *)&p);
  }
  if (*(int *)Params.nInspLimit < 0x80) {
    *(undefined4 *)Params.nInspLimit = 0x80;
  }
  if (0x8000 < *(int *)Params.nInspLimit) {
    *(undefined4 *)Params.nInspLimit = 0x8000;
  }
  if (*(int *)(Params.nInspLimit + 4) < 0x80) {
    *(undefined4 *)(Params.nInspLimit + 4) = 0x80;
  }
  if (0x8000 < *(int *)(Params.nInspLimit + 4)) {
    *(undefined4 *)(Params.nInspLimit + 4) = 0x8000;
  }
  if (*(int *)(Params.nInspLimit + 0x10) == 0) {
    *(undefined4 *)(Params.nInspLimit + 4) = 0x80;
    *(undefined4 *)Params.nInspLimit = 0x80;
  }
  p_00 = (Fraig_Man_t *)malloc(0x1d0);
  memset(p_00,0,0x1d0);
  p_00->nWordsRand =
       (*(int *)Params.nInspLimit >> 5) + (uint)((*(uint *)Params.nInspLimit & 0x1f) != 0);
  p_00->nWordsDyna =
       (*(int *)(Params.nInspLimit + 4) >> 5) +
       (uint)((*(uint *)(Params.nInspLimit + 4) & 0x1f) != 0);
  p_00->nBTLimit = *(int *)(Params.nInspLimit + 8);
  p_00->nSeconds = *(int *)(Params.nInspLimit + 0xc);
  p_00->fFuncRed = *(int *)(Params.nInspLimit + 0x10);
  p_00->fFeedBack = *(int *)(Params.nInspLimit + 0x14);
  p_00->fDist1Pats = *(int *)(Params.nInspLimit + 0x18);
  p_00->fDoSparse = *(int *)(Params.nInspLimit + 0x1c);
  p_00->fChoicing = *(int *)(Params.nInspLimit + 0x20);
  p_00->fTryProve = *(int *)(Params.nInspLimit + 0x24);
  p_00->fVerbose = *(int *)(Params.nInspLimit + 0x28);
  p_00->fVerboseP = *(int *)(Params.nInspLimit + 0x2c);
  p_00->nInspLimit = *(ABC_INT64_T *)(Params.nInspLimit + 0x38);
  pFVar1 = Fraig_MemFixedStart(0xa0);
  p_00->mmNodes = pFVar1;
  pFVar1 = Fraig_MemFixedStart((p_00->nWordsRand + p_00->nWordsDyna) * 4);
  p_00->mmSims = pFVar1;
  pFVar2 = Fraig_NodeVecAlloc(1000);
  p_00->vInputs = pFVar2;
  pFVar2 = Fraig_NodeVecAlloc(1000);
  p_00->vOutputs = pFVar2;
  pFVar2 = Fraig_NodeVecAlloc(1000);
  p_00->vNodes = pFVar2;
  pFVar3 = Fraig_HashTableCreate(1000);
  p_00->pTableS = pFVar3;
  pFVar3 = Fraig_HashTableCreate(1000);
  p_00->pTableF = pFVar3;
  pFVar3 = Fraig_HashTableCreate(1000);
  p_00->pTableF0 = pFVar3;
  pFVar4 = Fraig_NodeCreateConst(p_00);
  p_00->pConst1 = pFVar4;
  Fraig_FeedBackInit(p_00);
  pMVar5 = Msat_IntVecAlloc(10);
  p_00->vProj = pMVar5;
  p_00->nTravIds = 1;
  p_00->nTravIds2 = 1;
  return p_00;
}

Assistant:

Fraig_Man_t * Fraig_ManCreate( Fraig_Params_t * pParams )
{
    Fraig_Params_t Params;
    Fraig_Man_t * p;

    // set the random seed for simulation
//    srand( 0xFEEDDEAF );
//    srand( 0xDEADCAFE );
    Aig_ManRandom( 1 );

    // set parameters for equivalence checking
    if ( pParams == NULL )
        Fraig_ParamsSetDefault( pParams = &Params );
    // adjust the amount of simulation info
    if ( pParams->nPatsRand < 128 )
        pParams->nPatsRand = 128;
    if ( pParams->nPatsRand > 32768 )
        pParams->nPatsRand = 32768;
    if ( pParams->nPatsDyna < 128 )
        pParams->nPatsDyna = 128;
    if ( pParams->nPatsDyna > 32768 )
        pParams->nPatsDyna = 32768;
    // if reduction is not performed, allocate minimum simulation info
    if ( !pParams->fFuncRed )
        pParams->nPatsRand = pParams->nPatsDyna = 128;

    // start the manager
    p = ABC_ALLOC( Fraig_Man_t, 1 );
    memset( p, 0, sizeof(Fraig_Man_t) );

    // set the default parameters
    p->nWordsRand = FRAIG_NUM_WORDS( pParams->nPatsRand );  // the number of words of random simulation info
    p->nWordsDyna = FRAIG_NUM_WORDS( pParams->nPatsDyna );  // the number of patterns for dynamic simulation info
    p->nBTLimit   = pParams->nBTLimit;    // -1 means infinite backtrack limit
    p->nSeconds   = pParams->nSeconds;    // the timeout for the final miter
    p->fFuncRed   = pParams->fFuncRed;    // enables functional reduction (otherwise, only one-level hashing is performed)
    p->fFeedBack  = pParams->fFeedBack;   // enables solver feedback (the use of counter-examples in simulation)
    p->fDist1Pats = pParams->fDist1Pats;  // enables solver feedback (the use of counter-examples in simulation)
    p->fDoSparse  = pParams->fDoSparse;   // performs equivalence checking for sparse functions (whose sim-info is 0)
    p->fChoicing  = pParams->fChoicing;   // disable accumulation of structural choices (keeps only the first choice)
    p->fTryProve  = pParams->fTryProve;   // disable accumulation of structural choices (keeps only the first choice)
    p->fVerbose   = pParams->fVerbose;    // disable verbose output
    p->fVerboseP  = pParams->fVerboseP;   // disable verbose output
    p->nInspLimit = pParams->nInspLimit;  // the limit on the number of inspections

    // start memory managers
    p->mmNodes    = Fraig_MemFixedStart( sizeof(Fraig_Node_t) );
    p->mmSims     = Fraig_MemFixedStart( sizeof(unsigned) * (p->nWordsRand + p->nWordsDyna) );
    // allocate node arrays
    p->vInputs    = Fraig_NodeVecAlloc( 1000 );    // the array of primary inputs
    p->vOutputs   = Fraig_NodeVecAlloc( 1000 );    // the array of primary outputs
    p->vNodes     = Fraig_NodeVecAlloc( 1000 );    // the array of internal nodes
    // start the tables
    p->pTableS    = Fraig_HashTableCreate( 1000 ); // hashing by structure
    p->pTableF    = Fraig_HashTableCreate( 1000 ); // hashing by function
    p->pTableF0   = Fraig_HashTableCreate( 1000 ); // hashing by function (for sparse functions)
    // create the constant node
    p->pConst1    = Fraig_NodeCreateConst( p );
    // initialize SAT solver feedback data structures
    Fraig_FeedBackInit( p );
    // initialize other variables
    p->vProj      = Msat_IntVecAlloc( 10 ); 
    p->nTravIds   = 1;
    p->nTravIds2  = 1;
    return p;
}